

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

int xmlSetListDoc(xmlNodePtr list,xmlDocPtr doc)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((list != (xmlNodePtr)0x0) && (iVar2 = 0, list->type != XML_NAMESPACE_DECL)) {
    iVar2 = 0;
    do {
      if (list->doc != doc) {
        iVar1 = xmlSetTreeDoc(list,doc);
        if (iVar1 < 0) {
          iVar2 = -1;
        }
      }
      list = list->next;
    } while (list != (_xmlNode *)0x0);
  }
  return iVar2;
}

Assistant:

int
xmlSetListDoc(xmlNodePtr list, xmlDocPtr doc) {
    xmlNodePtr cur;
    int ret = 0;

    if ((list == NULL) || (list->type == XML_NAMESPACE_DECL))
	return(0);

    cur = list;
    while (cur != NULL) {
	if (cur->doc != doc) {
	    if (xmlSetTreeDoc(cur, doc) < 0)
                ret = -1;
        }
	cur = cur->next;
    }

    return(ret);
}